

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Cluster::WriteClusterHeader(Cluster *this)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  undefined4 extraout_var;
  uint64 uVar4;
  
  if (this->finalized_ != false) {
    return false;
  }
  iVar2 = WriteID(this->writer_,0x1f43b675);
  if (iVar2 == 0) {
    iVar3 = (*this->writer_->_vptr_IMkvWriter[1])();
    this->size_position_ = CONCAT44(extraout_var,iVar3);
    iVar2 = SerializeInt(this->writer_,0x1ffffffffffffff,8);
    if ((iVar2 == 0) &&
       (bVar1 = WriteEbmlElement(this->writer_,0xe7,this->timecode_,
                                 (ulong)this->fixed_size_timecode_ << 3), bVar1)) {
      uVar4 = EbmlElementSize(0xe7,this->timecode_,(ulong)this->fixed_size_timecode_ << 3);
      this->payload_size_ = this->payload_size_ + uVar4;
      this->header_written_ = true;
      return true;
    }
  }
  return false;
}

Assistant:

bool Cluster::WriteClusterHeader() {
  if (finalized_)
    return false;

  if (WriteID(writer_, libwebm::kMkvCluster))
    return false;

  // Save for later.
  size_position_ = writer_->Position();

  // Write "unknown" (EBML coded -1) as cluster size value. We need to write 8
  // bytes because we do not know how big our cluster will be.
  if (SerializeInt(writer_, kEbmlUnknownValue, 8))
    return false;

  if (!WriteEbmlElement(writer_, libwebm::kMkvTimecode, timecode(),
                        fixed_size_timecode_ ? 8 : 0)) {
    return false;
  }
  AddPayloadSize(EbmlElementSize(libwebm::kMkvTimecode, timecode(),
                                 fixed_size_timecode_ ? 8 : 0));
  header_written_ = true;

  return true;
}